

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

Mat * deleteBg(Mat *img,Mat *out,Ptr<cv::BackgroundSubtractor> *bgs,bool learn,int thresh_sens_val)

{
  undefined7 in_register_00000009;
  int in_R9D;
  Mat res;
  Mat grayscale;
  Mat fgMask;
  _InputArray local_180;
  _InputArray local_168 [4];
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat local_f0 [96];
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  cv::Mat::Mat(img);
  local_168[0].sz.width = 0;
  local_168[0].sz.height = 0;
  local_168[0].flags = 0x1010000;
  local_180.sz.width = 0;
  local_180.sz.height = 0;
  local_180.flags = 0x2010000;
  local_180.obj = local_90;
  local_168[0].obj = out;
  (**(code **)(**(long **)CONCAT71(in_register_00000009,learn) + 0x40))
            (SUB84((double)thresh_sens_val,0));
  local_168[0].sz.width = 0;
  local_168[0].sz.height = 0;
  local_168[0].flags = 0x1010000;
  local_180.sz.width = 0;
  local_180.sz.height = 0;
  local_180.flags = 0x2010000;
  local_180.obj = img;
  local_168[0].obj = local_90;
  cv::threshold(local_168,(_OutputArray *)&local_180,(double)in_R9D,255.0,0);
  mask_morph(img);
  cv::Mat::Mat((Mat *)local_168);
  local_180.sz.width = 0;
  local_180.sz.height = 0;
  local_180.flags = 0x2010000;
  local_f8 = 0;
  local_108 = 0x1010000;
  local_180.obj = local_168;
  local_100 = img;
  cv::Mat::copyTo((_OutputArray *)out,&local_180);
  cv::Mat::operator=((Mat *)bgs,(Mat *)local_168);
  cv::Mat::~Mat((Mat *)local_168);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  return img;
}

Assistant:

Mat deleteBg(Mat img, Mat &out, Ptr<BackgroundSubtractor> bgs, bool learn, int thresh_sens_val) {
    Mat fgMask, grayscale, threshDiff;
    bgs->apply(img, fgMask, learn);

    threshold(fgMask, threshDiff, thresh_sens_val, 255, THRESH_BINARY);
    mask_morph(threshDiff);

    Mat res;
    img.copyTo(res, threshDiff);
    out = res;

    return threshDiff;
}